

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status parse_h16(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  size_t i;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  i._4_4_ = parse_hexdigit(uri,len,offset,settings,userData);
  for (__TRY_initialOffset = 0; __TRY_initialOffset < 3;
      __TRY_initialOffset = __TRY_initialOffset + 1) {
    sVar1 = *offset;
    cVar2 = parse_hexdigit(uri,len,offset,settings,userData);
    if (cVar2 == curi_status_error) {
      *offset = sVar1;
      cVar2 = i._4_4_;
    }
    i._4_4_ = cVar2;
  }
  return i._4_4_;
}

Assistant:

static curi_status parse_h16(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // h16 = 1*4HEXDIG
    curi_status status = curi_status_success;
    size_t i;

    if (status == curi_status_success)
        status = parse_hexdigit(uri, len, offset, settings, userData);

    for (i = 0 ; i < 3 ; ++i)
        TRY(status,offset,parse_hexdigit(uri, len, offset, settings, userData));

    return status;
}